

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.hpp
# Opt level: O2

void hta::throw_exception<hta::MissingMetricConfig,char_const*,std::__cxx11::string>
               (char *args,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_1
               )

{
  MissingMetricConfig *this;
  string local_1e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c0;
  stringstream msg;
  
  std::__cxx11::stringstream::stringstream((stringstream *)&msg);
  std::__cxx11::string::string((string *)&local_1c0,(string *)args_1);
  detail::
  make_exception<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::operator()((make_exception<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)&local_1e0,&msg,args,&local_1c0);
  std::__cxx11::string::~string((string *)&local_1c0);
  this = (MissingMetricConfig *)__cxa_allocate_exception(0x10);
  std::__cxx11::stringbuf::str();
  MissingMetricConfig::Exception(this,&local_1e0);
  __cxa_throw(this,&MissingMetricConfig::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

[[noreturn]] inline void throw_exception(Args... args)
{
    std::stringstream msg;

    detail::make_exception<Args...>()(msg, args...);

    throw E(msg.str());
}